

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O2

void __thiscall
boost::python::
class_<SpikesConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
::id_vector::id_vector(id_vector *this)

{
  char *pcVar1;
  long lVar2;
  
  pcVar1 = _str;
  lVar2 = 0;
  do {
    *(char **)((long)&this->ids[0].m_base_type + lVar2) = pcVar1 + (*pcVar1 == '*');
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  this->ids[0].m_base_type = "14SpikesConsumer";
  this->ids[1].m_base_type = "20HFSubConsumer_python";
  return;
}

Assistant:

id_vector()
        {
            // Stick the derived class id into the first element of the array
            ids[0] = detail::unwrap_type_id((W*)0, (W*)0);

            // Write the rest of the elements into succeeding positions.
            type_info* p = ids + 1;
            mpl::for_each(detail::write_type_id(&p), (bases*)0, (add_pointer<mpl::_>*)0);
        }